

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZGenGrid2D.cpp
# Opt level: O1

bool __thiscall
TPZGenGrid2D::ReadAndMergeGeoMesh
          (TPZGenGrid2D *this,TPZGeoMesh *gridinitial,TPZGeoMesh *tomerge,int matid)

{
  bool bVar1;
  TPZGeoEl *pTVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  TPZGeoNode *pTVar8;
  TPZGeoNode *pTVar9;
  TPZGeoEl **ppTVar10;
  long lVar11;
  undefined4 extraout_var;
  int p_1;
  int iVar12;
  long lVar13;
  long lVar14;
  TPZAdmChunkVector<TPZGeoNode,_10> *this_00;
  ulong uVar15;
  int p;
  int iVar16;
  TPZChunkVector<TPZGeoNode,_10> *this_01;
  int64_t nelem;
  TPZVec<long> nos;
  TPZVec<double> coordtomerge;
  TPZVec<double> coordinitial;
  int64_t index;
  TPZGeoMesh gtomerge;
  TPZVec<long> local_360;
  TPZVec<double> local_340;
  long local_320;
  TPZChunkVector<TPZGeoNode,_10> *local_318;
  TPZGenGrid2D *local_310;
  int64_t local_308;
  TPZVec<double> local_300;
  undefined1 local_2e0 [8];
  TPZGeoMesh local_2d8;
  
  local_310 = this;
  iVar4 = (*this->_vptr_TPZGenGrid2D[2])(this,gridinitial,(ulong)(uint)matid);
  if (((short)iVar4 == 0) &&
     (((tomerge->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>.fNElements != 0 ||
      ((tomerge->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements != 0)))) {
    TPZGeoMesh::TPZGeoMesh(&local_2d8,tomerge);
    lVar13 = (gridinitial->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>.fNElements;
    local_340._vptr_TPZVec = (_func_int **)0x0;
    TPZVec<double>::TPZVec(&local_300,3,(double *)&local_340);
    local_360._vptr_TPZVec = (_func_int **)0x0;
    TPZVec<double>::TPZVec(&local_340,3,(double *)&local_360);
    if (0 < local_2d8.fNodeVec.super_TPZChunkVector<TPZGeoNode,_10>.fNElements) {
      this_01 = &local_2d8.fNodeVec.super_TPZChunkVector<TPZGeoNode,_10>;
      this_00 = &gridinitial->fNodeVec;
      nelem = 0;
      local_320 = lVar13;
      local_318 = this_01;
      do {
        pTVar8 = TPZChunkVector<TPZGeoNode,_10>::operator[](this_01,nelem);
        TPZGeoNode::GetCoordinates(pTVar8,&local_340);
        lVar14 = 0;
        lVar11 = lVar14;
        if (0 < lVar13) {
          do {
            pTVar9 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                               (&this_00->super_TPZChunkVector<TPZGeoNode,_10>,lVar14);
            TPZGeoNode::GetCoordinates(pTVar9,&local_300);
            dVar3 = (local_340.fStore[2] - local_300.fStore[2]) *
                    (local_340.fStore[2] - local_300.fStore[2]) +
                    (*local_340.fStore - *local_300.fStore) *
                    (*local_340.fStore - *local_300.fStore) +
                    (local_340.fStore[1] - local_300.fStore[1]) *
                    (local_340.fStore[1] - local_300.fStore[1]);
            if (dVar3 < 0.0) {
              dVar3 = sqrt(dVar3);
            }
            else {
              dVar3 = SQRT(dVar3);
            }
            if (ABS(dVar3) < 1e-12) {
              TPZGeoNode::SetCoord(pTVar8,0,(double)pTVar8->fId);
              pTVar9 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                                 (&this_00->super_TPZChunkVector<TPZGeoNode,_10>,lVar14);
              pTVar8->fId = pTVar9->fId;
              lVar11 = lVar14;
              break;
            }
            lVar14 = lVar14 + 1;
            lVar11 = lVar13;
          } while (lVar13 != lVar14);
        }
        if (lVar11 == lVar13) {
          local_308 = nelem;
          iVar5 = TPZAdmChunkVector<TPZGeoNode,_10>::AllocateNewElement(this_00);
          pTVar9 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                             (&this_00->super_TPZChunkVector<TPZGeoNode,_10>,(long)iVar5);
          TPZGeoNode::Initialize(pTVar9,&local_340,gridinitial);
          pTVar9 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                             (&this_00->super_TPZChunkVector<TPZGeoNode,_10>,(long)iVar5);
          if (0 < local_2d8.fElementVec.super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements) {
            iVar5 = pTVar9->fId;
            iVar12 = pTVar8->fId;
            lVar13 = 0;
            do {
              ppTVar10 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                                   (&local_2d8.fElementVec.super_TPZChunkVector<TPZGeoEl_*,_10>,
                                    lVar13);
              pTVar2 = *ppTVar10;
              if (pTVar2 != (TPZGeoEl *)0x0) {
                for (iVar16 = 0; iVar6 = (**(code **)(*(long *)pTVar2 + 0x90))(pTVar2),
                    iVar16 < iVar6; iVar16 = iVar16 + 1) {
                  lVar11 = (**(code **)(*(long *)pTVar2 + 0xa8))(pTVar2,iVar16);
                  if (lVar11 == iVar12) {
                    (**(code **)(*(long *)pTVar2 + 0x178))(pTVar2,iVar16,(long)iVar5);
                  }
                }
              }
              lVar13 = lVar13 + 1;
            } while (lVar13 < local_2d8.fElementVec.super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements)
            ;
          }
          pTVar8->fId = -1;
          lVar13 = local_320;
          this_01 = local_318;
          nelem = local_308;
        }
        nelem = nelem + 1;
      } while (nelem != local_2d8.fNodeVec.super_TPZChunkVector<TPZGeoNode,_10>.fNElements);
    }
    if (0 < local_2d8.fNodeVec.super_TPZChunkVector<TPZGeoNode,_10>.fNElements) {
      lVar13 = 0;
      do {
        pTVar8 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                           (&local_2d8.fNodeVec.super_TPZChunkVector<TPZGeoNode,_10>,lVar13);
        iVar5 = pTVar8->fId;
        if (((long)iVar5 != -1) &&
           (0 < local_2d8.fElementVec.super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements)) {
          dVar3 = pTVar8->fCoord[0];
          lVar11 = 0;
          do {
            ppTVar10 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                                 (&local_2d8.fElementVec.super_TPZChunkVector<TPZGeoEl_*,_10>,lVar11
                                 );
            pTVar2 = *ppTVar10;
            if (pTVar2 != (TPZGeoEl *)0x0) {
              for (iVar12 = 0; iVar16 = (**(code **)(*(long *)pTVar2 + 0x90))(pTVar2),
                  iVar12 < iVar16; iVar12 = iVar12 + 1) {
                lVar14 = (**(code **)(*(long *)pTVar2 + 0xa8))(pTVar2,iVar12);
                if (lVar14 == (long)dVar3) {
                  (**(code **)(*(long *)pTVar2 + 0x178))(pTVar2,iVar12,(long)iVar5);
                }
              }
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 < local_2d8.fElementVec.super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements);
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 != local_2d8.fNodeVec.super_TPZChunkVector<TPZGeoNode,_10>.fNElements);
    }
    if (0 < local_2d8.fElementVec.super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements) {
      lVar13 = 0;
      do {
        ppTVar10 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                             (&local_2d8.fElementVec.super_TPZChunkVector<TPZGeoEl_*,_10>,lVar13);
        pTVar2 = *ppTVar10;
        if (pTVar2 != (TPZGeoEl *)0x0) {
          local_360._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
          local_360.fStore = (long *)0x0;
          local_360.fNElements = 0;
          local_360.fNAlloc = 0;
          iVar5 = (**(code **)(*(long *)pTVar2 + 0x90))(pTVar2);
          iVar12 = (**(code **)(*(long *)pTVar2 + 0x90))(pTVar2);
          TPZVec<long>::Resize(&local_360,(long)iVar12);
          if (0 < iVar5) {
            uVar15 = 0;
            do {
              lVar11 = (**(code **)(*(long *)pTVar2 + 0xa8))(pTVar2,uVar15 & 0xffffffff);
              local_360.fStore[uVar15] = lVar11;
              uVar15 = uVar15 + 1;
            } while ((long)iVar5 != uVar15);
          }
          bVar1 = local_310->fRefPattern;
          uVar7 = (**(code **)(*(long *)pTVar2 + 0xb8))(pTVar2);
          iVar5 = (*(gridinitial->super_TPZSavable)._vptr_TPZSavable[0xc])
                            (gridinitial,(ulong)uVar7,&local_360,(ulong)(uint)pTVar2->fMatId,
                             local_2e0,(ulong)bVar1);
          if (CONCAT44(extraout_var,iVar5) == 0) {
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZGenGrid2D.cpp"
                       ,0x111);
          }
          local_360._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
          if (local_360.fStore != (long *)0x0) {
            operator_delete__(local_360.fStore);
          }
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 != local_2d8.fElementVec.super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements);
    }
    TPZGeoMesh::ResetConnectivities(gridinitial);
    TPZGeoMesh::BuildConnectivity(gridinitial);
    local_340._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
    if (local_340.fStore != (double *)0x0) {
      operator_delete__(local_340.fStore);
    }
    local_300._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
    if (local_300.fStore != (double *)0x0) {
      operator_delete__(local_300.fStore);
    }
    TPZGeoMesh::~TPZGeoMesh(&local_2d8);
  }
  return (short)iVar4 == 0;
}

Assistant:

bool TPZGenGrid2D::ReadAndMergeGeoMesh(TPZGeoMesh* gridinitial, TPZGeoMesh* tomerge, int matid) {
    // gridinitial is created by TPZGenGrid2D current
    if (Read(gridinitial, matid))
        return false;
    if (!tomerge->NNodes() && !tomerge->NElements())
        return true;

    // Copy vectors for nodes and elements of the gridtomerge, then the original data is preserved
    TPZGeoMesh gtomerge(*tomerge);
    TPZGeoMesh *gridtomerge = &gtomerge;

    int64_t i, j, k, nnodestomerge = gridtomerge->NNodes();
    int64_t nnodesinitial = gridinitial->NNodes();
    //    int nneltomerge = gridtomerge->NElements();
    TPZVec<REAL> coordinitial(3, 0.);
    TPZVec<REAL> coordtomerge(3, 0.);
    TPZGeoNode *nodetomerge;
    TPZGeoEl *gel;
    // Verifing each node in gridtomerge if exist into the gridinitial (as same coordinates). It is inefficient.
    for (i = 0; i < nnodestomerge; i++) {
        nodetomerge = &(gridtomerge->NodeVec()[i]);
        if (!nodetomerge) continue;
        nodetomerge->GetCoordinates(coordtomerge);
        for (j = 0; j < nnodesinitial; j++) {
            gridinitial->NodeVec()[j].GetCoordinates(coordinitial);
            if (IsZero(Distance(coordtomerge, coordinitial))) {
                // In this case exists a node with same coordinates, then the id is update as id of the gridinitial with same coordinates
                // and the old id is stored in coord[0]
                nodetomerge->SetCoord(0, nodetomerge->Id());
                nodetomerge->SetNodeId(gridinitial->NodeVec()[j].Id());
                break;
            }
        }

        // If the node (i) not exists into the gridinitial is created a new node copy in this grid, and is substitutived in all the 
        // elements in gridinitial the id as old node with the id of the new node. At last the id of the node duplicated is put as -1
        if (j == nnodesinitial) {
            // resizing the vector of the nodes
            int64_t index = gridinitial->NodeVec().AllocateNewElement();
            gridinitial->NodeVec()[index].Initialize(coordtomerge, *gridinitial);
            index = gridinitial->NodeVec()[index].Id();
            int64_t oldid = nodetomerge->Id();
            for (k = 0; k < gridtomerge->NElements(); k++) {
                gel = gridtomerge->ElementVec()[k];
                if (!gel) continue;
                for (int p = 0; p < gel->NNodes(); p++)
                    if (gel->NodeIndex(p) == oldid)
                        gel->SetNodeIndex(p, index);
            }
            nodetomerge->SetNodeId(-1);
        }
    }

    // changing the id of the repeated nodes into the geometric elements of the gridtomerge
    for (i = 0; i < nnodestomerge; i++) {
        nodetomerge = &(gridtomerge->NodeVec()[i]);
        if (!nodetomerge || nodetomerge->Id() == -1) continue;
        int64_t idnew = nodetomerge->Id(), idold = (int64_t) (nodetomerge->Coord(0));
        for (k = 0; k < gridtomerge->NElements(); k++) {
            gel = gridtomerge->ElementVec()[k];
            if (!gel) continue;
            for (int p = 0; p < gel->NNodes(); p++)
                if (gel->NodeIndex(p) == idold)
                    gel->SetNodeIndex(p, idnew);
        }
    }

    // creating new element into gridinitial corresponding for each element in gridtomerge
    int64_t nelmerge = gridtomerge->NElements();
    for (i = 0; i < nelmerge; i++) {
        gel = gridtomerge->ElementVec()[i];
        if (!gel) continue;
        TPZVec<int64_t> nos;
        int64_t ngelnodes = gel->NNodes(), index;
        nos.Resize(gel->NNodes());
        for (j = 0; j < ngelnodes; j++)
            nos[j] = gel->NodeIndex(j);
        int eltype = 1;
        if (fRefPattern == false) {
            eltype = 0;
        }

        if (!gridinitial->CreateGeoElement(gel->Type(), nos, gel->MaterialId(), index, eltype))
            DebugStop();
    }

    // computing the connectivity
    gridinitial->ResetConnectivities();
    gridinitial->BuildConnectivity();
    return true;
}